

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O3

TVariableIndex __thiscall
Refal2::CVariablesBuilder::AddLeft(CVariablesBuilder *this,TVariableName name,TVariableTypeTag type)

{
  int *piVar1;
  int iVar2;
  TVariableType type_00;
  _WordT _Var3;
  undefined4 uVar4;
  CQualifier *pCVar5;
  bool bVar6;
  TVariableType TVar7;
  long lVar8;
  int iVar9;
  CQualifier *this_00;
  CQualifier *defaultQualifier;
  CQualifier *local_38;
  
  local_38 = (CQualifier *)0x0;
  TVar7 = checkTypeTag(this,type,&local_38);
  iVar9 = -1;
  if (TVar7 != VT_None) {
    bVar6 = checkName(this,name);
    if (bVar6) {
      iVar2 = *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)name * 4);
      lVar8 = (long)iVar2;
      if (lVar8 == -1) {
        iVar9 = this->firstFreeVariableIndex;
        *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)name * 4) = iVar9;
        this->firstFreeVariableIndex = iVar9 + 1;
        this_00 = &this->variables[iVar9].Qualifier;
        this->variables[iVar9].Type = TVar7;
        this->variables[iVar9].CountLeft = 1;
        this->variables[iVar9].CountRight = 0;
        bVar6 = CQualifier::IsEmpty(this_00);
        pCVar5 = local_38;
        if (!bVar6) {
          __assert_fail("variable.Qualifier.IsEmpty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                        ,0x83,
                        "TVariableIndex Refal2::CVariablesBuilder::AddLeft(const TVariableName, const TVariableTypeTag)"
                       );
        }
        if (local_38 != (CQualifier *)0x0) {
          this->variables[iVar9].Qualifier.ansichars.super__Base_bitset<2UL>._M_w[1] =
               (local_38->ansichars).super__Base_bitset<2UL>._M_w[1];
          uVar4 = *(undefined4 *)&local_38->field_0x4;
          _Var3 = (local_38->ansichars).super__Base_bitset<2UL>._M_w[0];
          this_00->flags = local_38->flags;
          *(undefined4 *)&this_00->field_0x4 = uVar4;
          this->variables[iVar9].Qualifier.ansichars.super__Base_bitset<2UL>._M_w[0] = _Var3;
          CFastSet<char>::operator=(&this->variables[iVar9].Qualifier.chars,&local_38->chars);
          CFastSet<int>::operator=(&this->variables[iVar9].Qualifier.labels,&pCVar5->labels);
          CFastSet<unsigned_int>::operator=
                    (&this->variables[iVar9].Qualifier.numbers,&pCVar5->numbers);
        }
      }
      else {
        type_00 = this->variables[lVar8].Type;
        if (type_00 == TVar7) {
          piVar1 = &this->variables[lVar8].CountRight;
          *piVar1 = *piVar1 + 1;
          iVar9 = iVar2;
        }
        else {
          errorTypesNotMatched(this,name,type_00);
        }
      }
    }
  }
  return iVar9;
}

Assistant:

TVariableIndex CVariablesBuilder::AddLeft( const TVariableName name,
	const TVariableTypeTag type )
{
	const CQualifier* defaultQualifier = nullptr;
	const TVariableType variableType = checkTypeTag( type, &defaultQualifier );
	if( variableType != VT_None && checkName( name ) ) {
		if( variableNameToIndex[name] == InvalidVariableIndex ) {
			variableNameToIndex[name] = firstFreeVariableIndex;
			firstFreeVariableIndex++;
			const TVariableIndex variableIndex = variableNameToIndex[name];
			CVariableData& variable = variables[variableIndex];
			variable.Type = variableType;
			variable.CountLeft = 1;
			variable.CountRight = 0;
			assert( variable.Qualifier.IsEmpty() );
			if( defaultQualifier != nullptr ) {
				variable.Qualifier = *defaultQualifier;
			}
			return variableIndex;
		} else {
			const TVariableIndex variableIndex = variableNameToIndex[name];
			CVariableData& variable = variables[variableIndex];
			if( variable.Type == variableType ) {
				variable.CountRight++;
				return variableIndex;
			} else {
				errorTypesNotMatched( name, variable.Type );
			}
		}
	}
	return InvalidVariableIndex;
}